

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O3

char * rtosc_bundle_fetch(char *buffer,uint elm)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  
  puVar3 = (uint *)(buffer + 0x10);
  if (elm != 0) {
    uVar4 = (ulong)elm;
    do {
      uVar1 = *puVar3;
      uVar2 = (uVar1 & 0xff0000) >> 8;
      if (((uVar1 >> 0x18 == 0 && uVar2 == 0) && (uVar1 & 0xff00) == 0) && uVar1 << 0x18 == 0) {
        return (char *)0x0;
      }
      puVar3 = (uint *)((long)puVar3 +
                       (ulong)(uVar1 >> 0x18 & 0xfffffffc | uVar2 | (uVar1 & 0xff00) << 8 |
                              uVar1 << 0x18) + 4);
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return (char *)(puVar3 + 1);
}

Assistant:

const char *rtosc_bundle_fetch(const char *buffer, unsigned elm)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elm_pos = 0;
    while(elm_pos!=elm && extract_uint32((const uint8_t*)lengths)) {
        ++elm_pos;
        lengths += extract_uint32((const uint8_t*)lengths)/4+1;
    }

    return (const char*) (elm==elm_pos?lengths+1:NULL);
}